

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O1

uint8_t * zmq_z85_decode(uint8_t *dest_,char *string_)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint divisor;
  ulong uVar12;
  
  sVar5 = strlen(string_);
  if ((4 < sVar5) && (sVar5 == (sVar5 / 5) * 5)) {
    uVar4 = 0;
    uVar9 = 0;
    iVar10 = 0;
    do {
      cVar1 = string_[uVar9];
      if (cVar1 == '\0') {
        if ((uint)((int)uVar9 * -0x33333333) < 0x33333334) {
          return dest_;
        }
        break;
      }
      if (0x3030303 < uVar4) break;
      uVar4 = uVar4 * 0x55;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      if (cVar1 < ' ') {
        bVar3 = false;
      }
      else {
        bVar2 = decoder[(byte)(cVar1 - 0x20)];
        uVar7 = uVar4 + bVar2;
        bVar3 = false;
        if (((bVar2 != 0xff) && (!CARRY4(uVar4,(uint)bVar2))) &&
           (bVar3 = true, uVar4 = uVar7, uVar8 * -0x33333333 < 0x33333334)) {
          uVar12 = 0x1000000;
          iVar11 = 0;
          do {
            dest_[(uint)(iVar10 + iVar11)] = (uint8_t)(uVar7 / uVar12);
            uVar12 = uVar12 >> 8;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 4);
          iVar10 = iVar10 + 4;
          uVar4 = 0;
        }
      }
    } while (bVar3);
  }
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *zmq_z85_decode (uint8_t *dest_, const char *string_)
{
    unsigned int byte_nbr = 0;
    unsigned int char_nbr = 0;
    uint32_t value = 0;
    size_t src_len = strlen (string_);

    if (src_len < 5 || src_len % 5 != 0)
        goto error_inval;

    while (string_[char_nbr]) {
        //  Accumulate value in base 85
        if (UINT32_MAX / 85 < value) {
            //  Invalid z85 encoding, represented value exceeds 0xffffffff
            goto error_inval;
        }
        value *= 85;
        const uint8_t index = string_[char_nbr++] - 32;
        if (index >= sizeof (decoder)) {
            //  Invalid z85 encoding, character outside range
            goto error_inval;
        }
        const uint32_t summand = decoder[index];
        if (summand == 0xFF || summand > (UINT32_MAX - value)) {
            //  Invalid z85 encoding, invalid character or represented value exceeds 0xffffffff
            goto error_inval;
        }
        value += summand;
        if (char_nbr % 5 == 0) {
            //  Output value in base 256
            unsigned int divisor = 256 * 256 * 256;
            while (divisor) {
                dest_[byte_nbr++] = value / divisor % 256;
                divisor /= 256;
            }
            value = 0;
        }
    }
    if (char_nbr % 5 != 0) {
        goto error_inval;
    }
    assert (byte_nbr == strlen (string_) * 4 / 5);
    return dest_;

error_inval:
    errno = EINVAL;
    return NULL;
}